

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::flipClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t in_RDX;
  ulong in_RSI;
  Roaring *in_RDI;
  Roaring *bitmap;
  _Self temp_1;
  Roaring *bitmap_3;
  uint32_t i;
  _Self temp;
  Roaring *bitmap_2;
  uint32_t num_intermediate_bitmaps;
  Roaring *bitmap_1;
  iterator current_iter;
  uint32_t uint32_max;
  uint32_t end_low;
  uint32_t end_high;
  uint32_t start_low;
  uint32_t start_high;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *in_stack_ffffffffffffff68;
  _Self in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  undefined4 local_6c;
  uint32_t in_stack_ffffffffffffffd0;
  
  if (in_RSI <= in_RDX) {
    uVar1 = highBytes(in_RSI);
    lowBytes(in_RSI);
    uVar2 = highBytes(in_RDX);
    uVar3 = lowBytes(in_RDX);
    ensureRangePopulated((Roaring64Map *)CONCAT44(uVar2,uVar3),0xffffffff,in_stack_ffffffffffffffd0)
    ;
    if (uVar1 == uVar2) {
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10b712);
      Roaring::flipClosed(in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff78._M_node,
                   (iterator)in_stack_ffffffffffffff80._M_node);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10b770);
      Roaring::flipClosed(in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                (in_stack_ffffffffffffff68,(int)((ulong)in_RDI >> 0x20));
      eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff78._M_node,
                   (iterator)in_stack_ffffffffffffff80._M_node);
      for (local_6c = 0; local_6c != (uVar2 - uVar1) + -1; local_6c = local_6c + 1) {
        std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10b7d5);
        Roaring::flipClosed(in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff78 =
             std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                       (in_stack_ffffffffffffff68,(int)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff78;
        eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff78._M_node,
                     (iterator)in_stack_ffffffffffffff78._M_node);
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10b830);
      Roaring::flipClosed(in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      eraseIfEmpty((Roaring64Map *)in_stack_ffffffffffffff78._M_node,
                   (iterator)in_stack_ffffffffffffff80._M_node);
    }
  }
  return;
}

Assistant:

void flipClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // Fill in any nonexistent slots with empty Roarings. This simplifies
        // the logic below, allowing it to simply iterate over the map between
        // 'start_high' and 'end_high' in a linear fashion.
        auto current_iter = ensureRangePopulated(start_high, end_high);

        // If start and end land on the same inner bitmap, then we can do the
        // whole operation in one call.
        if (start_high == end_high) {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(start_low, end_low);
            eraseIfEmpty(current_iter);
            return;
        }

        // Because start and end don't land on the same inner bitmap,
        // we need to do this in multiple steps:
        // 1. Partially flip the first bitmap in the closed interval
        //    [start_low, uint32_max]
        // 2. Flip intermediate bitmaps completely: [0, uint32_max]
        // 3. Partially flip the last bitmap in the closed interval
        //    [0, end_low]

        auto num_intermediate_bitmaps = end_high - start_high - 1;

        // 1. Partially flip the first bitmap.
        {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(start_low, uint32_max);
            auto temp = current_iter++;
            eraseIfEmpty(temp);
        }

        // 2. Flip intermediate bitmaps completely.
        for (uint32_t i = 0; i != num_intermediate_bitmaps; ++i) {
            auto &bitmap = current_iter->second;
            bitmap.flipClosed(0, uint32_max);
            auto temp = current_iter++;
            eraseIfEmpty(temp);
        }

        // 3. Partially flip the last bitmap.
        auto &bitmap = current_iter->second;
        bitmap.flipClosed(0, end_low);
        eraseIfEmpty(current_iter);
    }